

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O2

void __thiscall QSignalSpy::appendArgs(QSignalSpy *this,void **a)

{
  QMutex *this_00;
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QMetaType local_80;
  QArrayDataPointer<QVariant> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QVariant *)0x0;
  local_78.size = 0;
  QList<QVariant>::reserve((QList<QVariant> *)&local_78,(this->args).d.size);
  for (uVar2 = 0; uVar2 < (ulong)(this->args).d.size; uVar2 = uVar2 + 1) {
    iVar1 = (this->args).d.ptr[uVar2];
    if (iVar1 == 0x29) {
      QList<QVariant>::emplaceBack<QVariant_const&>
                ((QList<QVariant> *)&local_78,(QVariant *)a[uVar2 + 1]);
    }
    else {
      QMetaType::QMetaType(&local_80,iVar1);
      QVariant::QVariant((QVariant *)&local_58,local_80,a[uVar2 + 1]);
      QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_78,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
    }
  }
  this_00 = &this->m_mutex;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)this_00;
  QBasicMutex::lock(&this_00->super_QBasicMutex);
  local_58.data[8] = '\x01';
  QList<QList<QVariant>>::emplaceBack<QList<QVariant>>
            ((QList<QList<QVariant>> *)this,(QList<QVariant> *)&local_78);
  if (this->m_waiting == true) {
    QBasicMutex::unlock(&this_00->super_QBasicMutex);
    local_58.data[8] = '\0';
    QTestEventLoop::exitLoop(&this->m_loop);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)&local_58);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalSpy::appendArgs(void **a)
{
    QList<QVariant> list;
    list.reserve(args.size());
    for (qsizetype i = 0; i < args.size(); ++i) {
        const QMetaType::Type type = static_cast<QMetaType::Type>(args.at(i));
        if (type == QMetaType::QVariant)
            list << *reinterpret_cast<QVariant *>(a[i + 1]);
        else
            list << QVariant(QMetaType(type), a[i + 1]);
    }
    QMutexLocker locker(&m_mutex);
    append(std::move(list));

    if (m_waiting) {
        locker.unlock();
        m_loop.exitLoop();
    }
}